

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O2

Reg ra_evict(ASMState *as,RegSet allow)

{
  uint uVar1;
  IRRef ref;
  Reg RVar2;
  uint uVar3;
  ulong uStack_8;
  
  if (allow < 0x10000) {
    if ((allow & 1) == 0) {
      uStack_8 = 0xffffffffffffffff;
    }
    else {
      uStack_8 = (ulong)as->cost[0];
    }
    if ((allow & 2) != 0) {
      uVar3 = (uint)uStack_8;
      uStack_8 = uStack_8 & 0xffffffff;
      if (as->cost[1] < uVar3) {
        uStack_8 = (ulong)as->cost[1];
      }
    }
    if ((allow & 4) != 0) {
      uVar3 = (uint)uStack_8;
      uStack_8 = uStack_8 & 0xffffffff;
      if (as->cost[2] < uVar3) {
        uStack_8 = (ulong)as->cost[2];
      }
    }
    if ((allow & 8) != 0) {
      uVar3 = (uint)uStack_8;
      uStack_8 = uStack_8 & 0xffffffff;
      if (as->cost[3] < uVar3) {
        uStack_8 = (ulong)as->cost[3];
      }
    }
    if ((allow & 0x20) != 0) {
      uVar3 = (uint)uStack_8;
      uStack_8 = uStack_8 & 0xffffffff;
      if (as->cost[5] < uVar3) {
        uStack_8 = (ulong)as->cost[5];
      }
    }
    if ((allow & 0x40) != 0) {
      uVar3 = (uint)uStack_8;
      uStack_8 = uStack_8 & 0xffffffff;
      if (as->cost[6] < uVar3) {
        uStack_8 = (ulong)as->cost[6];
      }
    }
    if ((char)allow < '\0') {
      uVar3 = (uint)uStack_8;
      uStack_8 = uStack_8 & 0xffffffff;
      if (as->cost[7] < uVar3) {
        uStack_8 = (ulong)as->cost[7];
      }
    }
    if ((allow >> 8 & 1) != 0) {
      uVar3 = (uint)uStack_8;
      uStack_8 = uStack_8 & 0xffffffff;
      if (as->cost[8] < uVar3) {
        uStack_8 = (ulong)as->cost[8];
      }
    }
    if ((allow >> 9 & 1) != 0) {
      uVar3 = (uint)uStack_8;
      uStack_8 = uStack_8 & 0xffffffff;
      if (as->cost[9] < uVar3) {
        uStack_8 = (ulong)as->cost[9];
      }
    }
    if ((allow >> 10 & 1) != 0) {
      uVar3 = (uint)uStack_8;
      uStack_8 = uStack_8 & 0xffffffff;
      if (as->cost[10] < uVar3) {
        uStack_8 = (ulong)as->cost[10];
      }
    }
    if ((allow >> 0xb & 1) != 0) {
      uVar3 = (uint)uStack_8;
      uStack_8 = uStack_8 & 0xffffffff;
      if (as->cost[0xb] < uVar3) {
        uStack_8 = (ulong)as->cost[0xb];
      }
    }
    if ((allow >> 0xc & 1) != 0) {
      uVar3 = (uint)uStack_8;
      uStack_8 = uStack_8 & 0xffffffff;
      if (as->cost[0xc] < uVar3) {
        uStack_8 = (ulong)as->cost[0xc];
      }
    }
    if ((allow >> 0xd & 1) != 0) {
      uVar3 = (uint)uStack_8;
      uStack_8 = uStack_8 & 0xffffffff;
      if (as->cost[0xd] < uVar3) {
        uStack_8 = (ulong)as->cost[0xd];
      }
    }
    if ((allow >> 0xe & 1) != 0) {
      uVar3 = (uint)uStack_8;
      uStack_8 = uStack_8 & 0xffffffff;
      if (as->cost[0xe] < uVar3) {
        uStack_8 = (ulong)as->cost[0xe];
      }
    }
    uVar3 = (uint)uStack_8;
    if (allow < 0x8000) goto LAB_00143fc5;
    uStack_8 = 0x3c;
  }
  else {
    if ((allow >> 0x10 & 1) == 0) {
      uStack_8 = 0xffffffffffffffff;
    }
    else {
      uStack_8 = (ulong)as->cost[0x10];
    }
    if ((allow >> 0x11 & 1) != 0) {
      uVar3 = (uint)uStack_8;
      uStack_8 = uStack_8 & 0xffffffff;
      if (as->cost[0x11] < uVar3) {
        uStack_8 = (ulong)as->cost[0x11];
      }
    }
    if ((allow >> 0x12 & 1) != 0) {
      uVar3 = (uint)uStack_8;
      uStack_8 = uStack_8 & 0xffffffff;
      if (as->cost[0x12] < uVar3) {
        uStack_8 = (ulong)as->cost[0x12];
      }
    }
    if ((allow >> 0x13 & 1) != 0) {
      uVar3 = (uint)uStack_8;
      uStack_8 = uStack_8 & 0xffffffff;
      if (as->cost[0x13] < uVar3) {
        uStack_8 = (ulong)as->cost[0x13];
      }
    }
    if ((allow >> 0x14 & 1) != 0) {
      uVar3 = (uint)uStack_8;
      uStack_8 = uStack_8 & 0xffffffff;
      if (as->cost[0x14] < uVar3) {
        uStack_8 = (ulong)as->cost[0x14];
      }
    }
    if ((allow >> 0x15 & 1) != 0) {
      uVar3 = (uint)uStack_8;
      uStack_8 = uStack_8 & 0xffffffff;
      if (as->cost[0x15] < uVar3) {
        uStack_8 = (ulong)as->cost[0x15];
      }
    }
    if ((allow >> 0x16 & 1) != 0) {
      uVar3 = (uint)uStack_8;
      uStack_8 = uStack_8 & 0xffffffff;
      if (as->cost[0x16] < uVar3) {
        uStack_8 = (ulong)as->cost[0x16];
      }
    }
    if ((allow >> 0x17 & 1) != 0) {
      uVar3 = (uint)uStack_8;
      uStack_8 = uStack_8 & 0xffffffff;
      if (as->cost[0x17] < uVar3) {
        uStack_8 = (ulong)as->cost[0x17];
      }
    }
    if ((allow >> 0x18 & 1) != 0) {
      uVar3 = (uint)uStack_8;
      uStack_8 = uStack_8 & 0xffffffff;
      if (as->cost[0x18] < uVar3) {
        uStack_8 = (ulong)as->cost[0x18];
      }
    }
    if ((allow >> 0x19 & 1) != 0) {
      uVar3 = (uint)uStack_8;
      uStack_8 = uStack_8 & 0xffffffff;
      if (as->cost[0x19] < uVar3) {
        uStack_8 = (ulong)as->cost[0x19];
      }
    }
    if ((allow >> 0x1a & 1) != 0) {
      uVar3 = (uint)uStack_8;
      uStack_8 = uStack_8 & 0xffffffff;
      if (as->cost[0x1a] < uVar3) {
        uStack_8 = (ulong)as->cost[0x1a];
      }
    }
    if ((allow >> 0x1b & 1) != 0) {
      uVar3 = (uint)uStack_8;
      uStack_8 = uStack_8 & 0xffffffff;
      if (as->cost[0x1b] < uVar3) {
        uStack_8 = (ulong)as->cost[0x1b];
      }
    }
    if ((allow >> 0x1c & 1) != 0) {
      uVar3 = (uint)uStack_8;
      uStack_8 = uStack_8 & 0xffffffff;
      if (as->cost[0x1c] < uVar3) {
        uStack_8 = (ulong)as->cost[0x1c];
      }
    }
    if ((allow >> 0x1d & 1) != 0) {
      uVar3 = (uint)uStack_8;
      uStack_8 = uStack_8 & 0xffffffff;
      if (as->cost[0x1d] < uVar3) {
        uStack_8 = (ulong)as->cost[0x1d];
      }
    }
    if ((allow >> 0x1e & 1) != 0) {
      uVar3 = (uint)uStack_8;
      uStack_8 = uStack_8 & 0xffffffff;
      if (as->cost[0x1e] < uVar3) {
        uStack_8 = (ulong)as->cost[0x1e];
      }
    }
    uVar3 = (uint)uStack_8;
    if (-1 < (int)allow) goto LAB_00143fc5;
    uStack_8 = 0x7c;
  }
  uVar1 = *(uint *)((long)as->cost + uStack_8);
  uStack_8 = (ulong)uVar3;
  if (uVar1 < uVar3) {
    uStack_8 = (ulong)uVar1;
  }
LAB_00143fc5:
  ref = (IRRef)(uStack_8 & 0xffff);
  if (0x7fff < ref) {
    uVar3 = allow & as->weakset;
    if ((uVar3 != 0) &&
       ((as->weakset >> (*(byte *)((long)as->ir + (uStack_8 & 0xffff) * 8 + 6) & 0x1f) & 1) == 0)) {
      uVar1 = 0;
      if (uVar3 != 0) {
        for (; (uVar3 >> uVar1 & 1) == 0; uVar1 = uVar1 + 1) {
        }
      }
      ref = (IRRef)(ushort)as->cost[uVar1];
    }
  }
  RVar2 = ra_restore(as,ref);
  return RVar2;
}

Assistant:

static Reg ra_evict(ASMState *as, RegSet allow)
{
  IRRef ref;
  RegCost cost = ~(RegCost)0;
  lj_assertA(allow != RSET_EMPTY, "evict from empty set");
  if (RID_NUM_FPR == 0 || allow < RID2RSET(RID_MAX_GPR)) {
    GPRDEF(MINCOST)
  } else {
    FPRDEF(MINCOST)
  }
  ref = regcost_ref(cost);
  lj_assertA(ra_iskref(ref) || (ref >= as->T->nk && ref < as->T->nins),
	     "evict of out-of-range IR %04d", ref - REF_BIAS);
  /* Preferably pick any weak ref instead of a non-weak, non-const ref. */
  if (!irref_isk(ref) && (as->weakset & allow)) {
    IRIns *ir = IR(ref);
    if (!rset_test(as->weakset, ir->r))
      ref = regcost_ref(as->cost[rset_pickbot((as->weakset & allow))]);
  }
  return ra_restore(as, ref);
}